

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary_unix.cpp
# Opt level: O0

bool __thiscall QLibraryPrivate::unload_sys(QLibraryPrivate *this)

{
  long lVar1;
  int iVar2;
  Type pvVar3;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  bool doTryUnload;
  char *error;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QString *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QString *in_stack_ffffffffffffff70;
  QString *in_stack_ffffffffffffff78;
  undefined1 local_69;
  QByteArrayView in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = QBasicAtomicPointer<void>::loadAcquire((QBasicAtomicPointer<void> *)0x8ce0c9);
  iVar2 = dlclose(pvVar3);
  if (iVar2 != 0) {
    dlerror();
    QLibrary::tr((char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                 (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    QByteArrayView::QByteArrayView<const_char_*,_true>
              (in_RDI,(char **)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    QString::fromLocal8Bit(in_stack_ffffffffffffffd0);
    QString::arg<QString_const&,QString>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(QString *)in_RDI);
    QString::operator=(in_stack_ffffffffffffff50,
                       (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QString::~QString((QString *)0x8ce174);
    QString::~QString((QString *)0x8ce17e);
    QString::~QString((QString *)0x8ce188);
  }
  else {
    QString::clear(in_stack_ffffffffffffff50);
  }
  local_69 = iVar2 == 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_69;
}

Assistant:

bool QLibraryPrivate::unload_sys()
{
    bool doTryUnload = true;
#ifndef RTLD_NODELETE
    if (loadHints() & QLibrary::PreventUnloadHint)
        doTryUnload = false;
#endif
    if (doTryUnload && dlclose(pHnd.loadAcquire())) {
        const char *error = dlerror();
#if defined (Q_OS_QNX)
        // Workaround until fixed in QNX; fixes crash in
        // QtDeclarative auto test "qqmlenginecleanup" for instance
        if (!qstrcmp(error, "Shared objects still referenced")) // On QNX that's only "informative"
            return true;
#endif
        errorString = QLibrary::tr("Cannot unload library %1: %2")
                .arg(fileName, QString::fromLocal8Bit(error));
        return false;
    }
    errorString.clear();
    return true;
}